

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-io.cpp
# Opt level: O3

ssize_t __thiscall wasm::ModuleWriter::write(ModuleWriter *this,int __fd,void *__buf,size_t __n)

{
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  ssize_t extraout_RAX_01;
  ssize_t sVar1;
  long lVar2;
  undefined4 in_register_00000034;
  ModuleWriter *this_00;
  _Alloc_hider _Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  string local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  lVar2 = *(long *)((long)__buf + 8);
  if (this->binary == true) {
    if (lVar2 != 0) {
      paVar4 = &local_68.field_2;
      local_68._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char*>((string *)&local_68,*__buf,lVar2 + *__buf);
      writeBinary(this,(Module *)CONCAT44(in_register_00000034,__fd),&local_68);
      sVar1 = extraout_RAX;
      _Var3._M_p = local_68._M_dataplus._M_p;
      goto LAB_00c8123e;
    }
    lVar2 = 0;
  }
  paVar4 = &local_38;
  this_00 = (ModuleWriter *)local_48;
  local_48[0] = paVar4;
  std::__cxx11::string::_M_construct<char*>((string *)local_48,*__buf,lVar2 + *__buf);
  writeText(this_00,(Module *)CONCAT44(in_register_00000034,__fd),(string *)local_48);
  sVar1 = extraout_RAX_00;
  _Var3._M_p = (pointer)local_48[0];
LAB_00c8123e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var3._M_p != paVar4) {
    operator_delete(_Var3._M_p,paVar4->_M_allocated_capacity + 1);
    sVar1 = extraout_RAX_01;
  }
  return sVar1;
}

Assistant:

void ModuleWriter::write(Module& wasm, std::string filename) {
  if (binary && filename.size() > 0) {
    writeBinary(wasm, filename);
  } else {
    writeText(wasm, filename);
  }
}